

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O1

Expression * __thiscall
soul::HEARTGenerator::evaluateAsExpression(HEARTGenerator *this,Expression *e)

{
  Category CVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  CastType CVar5;
  Constant *pCVar6;
  long *plVar7;
  long lVar8;
  long *plVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Scope *pSVar11;
  Variable *pVVar12;
  StructMemberRef *a;
  Expression *pEVar13;
  StructElement *pSVar14;
  ArrayElementRef *a_00;
  TypeCast *this_00;
  size_t sVar15;
  undefined4 extraout_var_02;
  ArraySize AVar16;
  BinaryOperator *this_01;
  Expression *pEVar17;
  BinaryOperator *source;
  Expression *pEVar18;
  Type *dest;
  pool_ptr<soul::AST::Constant> c;
  undefined1 local_f8 [8];
  Ptr local_f0;
  UTF8Reader local_e8;
  Expression *local_e0;
  CodeLocation local_d8;
  Type local_c8;
  CodeLocation local_b0;
  CompileMessage local_a0;
  CompileMessage local_68;
  long lVar10;
  undefined4 extraout_var_01;
  
  pVVar12 = (Variable *)local_f8;
  uVar3 = this->expressionDepth + 1;
  this->expressionDepth = uVar3;
  if (this->maxExpressionDepth <= uVar3) goto LAB_002267b1;
  (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(local_f8,e);
  lVar8 = CONCAT44(local_f8._4_4_,local_f8._0_4_);
  if (lVar8 != 0) {
    pCVar6 = PoolAllocator::allocate<soul::heart::Constant,soul::CodeLocation&,soul::Value&>
                       (&this->module->allocator->pool,(CodeLocation *)(lVar8 + 0x10),
                        (Value *)(lVar8 + 0x30));
    return &pCVar6->super_Expression;
  }
  plVar7 = (long *)__dynamic_cast(e,&AST::Expression::typeinfo,&AST::VariableRef::typeinfo,0);
  if (plVar7 != (long *)0x0) {
    bVar2 = AST::VariableDeclaration::isAssignable((VariableDeclaration *)plVar7[6]);
    if (bVar2) {
      plVar9 = *(long **)(plVar7[6] + 0x20);
      local_e0 = e;
      lVar8 = (**(code **)(*plVar9 + 0x28))(plVar9);
      if (lVar8 == 0) {
        do {
          plVar9 = (long *)(**(code **)(*plVar9 + 0x20))(plVar9);
          bVar2 = plVar9 == (long *)0x0;
          if (bVar2) goto LAB_002262e0;
          lVar8 = (**(code **)(*plVar9 + 0x28))(plVar9);
        } while (lVar8 == 0);
      }
      else {
        bVar2 = false;
      }
      if (bVar2) {
LAB_002262e0:
        lVar8 = 0;
      }
      pSVar11 = (local_e0->super_Statement).super_ASTObject.context.parentScope;
      iVar4 = (*pSVar11->_vptr_Scope[5])(pSVar11);
      lVar10 = CONCAT44(extraout_var,iVar4);
      if (lVar10 == 0) {
        do {
          iVar4 = (*pSVar11->_vptr_Scope[4])(pSVar11);
          pSVar11 = (Scope *)CONCAT44(extraout_var_01,iVar4);
          bVar2 = pSVar11 == (Scope *)0x0;
          if (bVar2) goto LAB_00226326;
          iVar4 = (*pSVar11->_vptr_Scope[5])(pSVar11);
          lVar10 = CONCAT44(extraout_var_00,iVar4);
        } while (lVar10 == 0);
      }
      else {
        bVar2 = false;
      }
      if (bVar2) {
LAB_00226326:
        lVar10 = 0;
      }
      e = local_e0;
      if (lVar8 != lVar10) {
        CompileMessageHelpers::createMessage<>
                  (&local_68,syntax,error,
                   "Cannot reference a mutable variable belonging to another processor");
        AST::Context::throwError((Context *)(plVar7 + 2),&local_68,false);
      }
    }
    pVVar12 = *(Variable **)(plVar7[6] + 0x70);
    if (pVVar12 == (Variable *)0x0) {
      pEVar18 = *(Expression **)(plVar7[6] + 0x38);
      if (pEVar18 == (Expression *)0x0) {
        (**(code **)(*plVar7 + 0x20))(local_f8,plVar7);
        pVVar12 = (Variable *)
                  heart::Allocator::allocateZeroInitialiser
                            (((this->builder).super_BlockBuilder.module)->allocator,(Type *)local_f8
                            );
        RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_e8.data);
      }
      else {
        pVVar12 = (Variable *)evaluateAsExpression(this,pEVar18);
      }
    }
  }
  if (plVar7 != (long *)0x0) {
    return &pVVar12->super_Expression;
  }
  a = (StructMemberRef *)
      __dynamic_cast(e,&AST::Expression::typeinfo,&AST::StructMemberRef::typeinfo,0);
  if (a != (StructMemberRef *)0x0) {
    getStructType((Type *)local_f8,this,a);
    pEVar13 = evaluateAsExpression(this,(a->object).object,(Type *)local_f8);
    pSVar14 = createStructSubElement(this,a,pEVar13);
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_e8.data);
    return &pSVar14->super_Expression;
  }
  a_00 = (ArrayElementRef *)
         __dynamic_cast(e,&AST::Expression::typeinfo,&AST::ArrayElementRef::typeinfo,0);
  if (a_00 != (ArrayElementRef *)0x0) {
    getArrayOrVectorType((Type *)local_f8,this,a_00);
    pEVar18 = (a_00->object).object;
    if (pEVar18 == (Expression *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    pEVar13 = evaluateAsExpression(this,pEVar18,(Type *)local_f8);
    pVVar12 = (Variable *)createArraySubElement(this,a_00,pEVar13);
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_e8.data);
  }
  if (a_00 != (ArrayElementRef *)0x0) {
    return &pVVar12->super_Expression;
  }
  this_00 = (TypeCast *)__dynamic_cast(e,&AST::Expression::typeinfo,&AST::TypeCast::typeinfo,0);
  if (this_00 == (TypeCast *)0x0) {
    bVar2 = true;
  }
  else {
    sVar15 = AST::TypeCast::getNumArguments(this_00);
    if (sVar15 == 0) {
      throwInternalCompilerError("c->getNumArguments() != 0","evaluateAsExpression",0x26b);
    }
    pEVar18 = (this_00->source).object;
    if (pEVar18 == (Expression *)0x0) {
      lVar8 = 0;
    }
    else {
      lVar8 = __dynamic_cast(pEVar18,&AST::Expression::typeinfo,&AST::CommaSeparatedList::typeinfo,0
                            );
    }
    bVar2 = true;
    if (lVar8 != 0) {
      if (*(long *)(lVar8 + 0x38) == 1) {
        pEVar18 = (Expression *)**(undefined8 **)(lVar8 + 0x30);
      }
      else {
        pVVar12 = createAggregateWithInitialisers(this,this_00);
        bVar2 = false;
      }
    }
    if (bVar2) {
      local_e0 = e;
      pEVar13 = evaluateAsExpression(this,pEVar18);
      iVar4 = (*(pEVar13->super_Object)._vptr_Object[2])(pEVar13);
      dest = &this_00->targetType;
      CVar5 = TypeRules::getCastType(dest,(Type *)CONCAT44(extraout_var_02,iVar4));
      if (CVar5 == notPossible) {
        CVar1 = (this_00->targetType).category;
        if ((((CVar1 & ~wrap) != vector) &&
            (CVar1 != array || (this_00->targetType).boundingSize == 0)) ||
           (AVar16 = Type::getNumAggregateElements(dest), AVar16 != 1)) {
          SanityCheckPass::expectCastPossible
                    (&(((this_00->source).object)->super_Statement).super_ASTObject.context,dest,
                     (Type *)CONCAT44(extraout_var_02,iVar4));
          bVar2 = true;
          e = local_e0;
          goto LAB_00226595;
        }
        pVVar12 = createAggregateWithInitialisers(this,this_00);
      }
      else {
        pVVar12 = (Variable *)
                  BlockBuilder::createCastIfNeeded
                            ((this->builder).super_BlockBuilder.module,pEVar13,dest);
      }
      bVar2 = false;
      e = local_e0;
    }
    else {
      bVar2 = false;
    }
  }
LAB_00226595:
  if (!bVar2) {
    return &pVVar12->super_Expression;
  }
  this_01 = (BinaryOperator *)
            __dynamic_cast(e,&AST::Expression::typeinfo,&AST::BinaryOperator::typeinfo,0);
  if (this_01 != (BinaryOperator *)0x0) {
    AST::BinaryOperator::resolveOpTypes(this_01);
    local_f8[0] = (this_01->resolvedOpTypes).operandType.category;
    local_f8[1] = (this_01->resolvedOpTypes).operandType.arrayElementCategory;
    local_f8[2] = (this_01->resolvedOpTypes).operandType.isRef;
    local_f8[3] = (this_01->resolvedOpTypes).operandType.isConstant;
    local_f8._4_4_ = (this_01->resolvedOpTypes).operandType.primitiveType.type;
    local_f0.object = *(SourceCodeText **)&(this_01->resolvedOpTypes).operandType.boundingSize;
    local_e8.data = (char *)(this_01->resolvedOpTypes).operandType.structure.object;
    if ((Structure *)local_e8.data != (Structure *)0x0) {
      (((Structure *)local_e8.data)->super_RefCountedObject).refCount =
           (((Structure *)local_e8.data)->super_RefCountedObject).refCount + 1;
    }
    pEVar13 = evaluateAsExpression(this,(this_01->lhs).object);
    pEVar13 = BlockBuilder::createCastIfNeeded
                        ((this->builder).super_BlockBuilder.module,pEVar13,(Type *)local_f8);
    pEVar17 = evaluateAsExpression(this,(this_01->rhs).object);
    pEVar17 = BlockBuilder::createCastIfNeeded
                        ((this->builder).super_BlockBuilder.module,pEVar17,(Type *)local_f8);
    local_b0.sourceCode.object =
         (this_01->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.
         object;
    if (local_b0.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_b0.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_b0.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_b0.location.data =
         (this_01->super_Expression).super_Statement.super_ASTObject.context.location.location.data;
    local_c8._0_4_ = this_01->operation;
    source = PoolAllocator::
             allocate<soul::heart::BinaryOperator,soul::CodeLocation,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
                       (&((this->builder).super_BlockBuilder.module)->allocator->pool,&local_b0,
                        pEVar13,pEVar17,(Op *)&local_c8);
    (*(this_01->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])
              (&local_c8,this_01);
    pVVar12 = (Variable *)
              BlockBuilder::createCastIfNeeded
                        ((this->builder).super_BlockBuilder.module,&source->super_Expression,
                         &local_c8);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_c8.structure.object);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_b0.sourceCode.object);
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_e8.data);
  }
  if (this_01 != (BinaryOperator *)0x0) {
    return &pVVar12->super_Expression;
  }
  plVar7 = (long *)__dynamic_cast(e,&AST::Expression::typeinfo,&AST::UnaryOperator::typeinfo,0);
  if (plVar7 != (long *)0x0) {
    (**(code **)(*plVar7 + 0x20))(local_f8,plVar7);
    pEVar13 = evaluateAsExpression(this,(Expression *)plVar7[6]);
    pEVar13 = BlockBuilder::createCastIfNeeded
                        ((this->builder).super_BlockBuilder.module,pEVar13,(Type *)local_f8);
    local_d8.sourceCode.object = (SourceCodeText *)plVar7[2];
    if (local_d8.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_d8.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_d8.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_d8.location.data = (char *)plVar7[3];
    local_c8._0_4_ = *(undefined4 *)(plVar7 + 7);
    pVVar12 = (Variable *)
              PoolAllocator::
              allocate<soul::heart::UnaryOperator,soul::CodeLocation,soul::heart::Expression&,soul::UnaryOp::Op&>
                        (&((this->builder).super_BlockBuilder.module)->allocator->pool,&local_d8,
                         pEVar13,(Op *)&local_c8);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_d8.sourceCode.object);
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_e8.data);
  }
  if (plVar7 != (long *)0x0) {
    return &pVVar12->super_Expression;
  }
  lVar8 = __dynamic_cast(e,&AST::Expression::typeinfo,&AST::ProcessorProperty::typeinfo,0);
  if (lVar8 != 0) {
    if (this->module->moduleType == namespaceModule) {
      CompileMessageHelpers::createMessage<>
                (&local_a0,syntax,error,
                 "Processor properties are only valid inside a processor declaration");
      AST::Context::throwError((Context *)(lVar8 + 0x10),&local_a0,false);
    }
    pVVar12 = (Variable *)
              PoolAllocator::
              allocate<soul::heart::ProcessorProperty,soul::CodeLocation&,soul::heart::ProcessorProperty::Property&>
                        (&this->module->allocator->pool,(CodeLocation *)(lVar8 + 0x10),
                         (Property *)(lVar8 + 0x2c));
  }
  if (lVar8 != 0) {
    return &pVVar12->super_Expression;
  }
LAB_002267b1:
  pEVar13 = getExpressionAsConstLocalCopy(this,e);
  return pEVar13;
}

Assistant:

heart::Expression& evaluateAsExpression (AST::Expression& e)
    {
        if (++expressionDepth < maxExpressionDepth)
        {
            if (auto c = e.getAsConstant())
                return module.allocator.allocate<heart::Constant> (c->context.location, c->value);

            if (auto v = cast<AST::VariableRef> (e))
            {
                if (v->variable->isAssignable())
                    if (v->variable->getParentScope()->findModule() != e.getParentScope()->findModule())
                        v->context.throwError (Errors::cannotReferenceOtherProcessorVar());

                if (auto a = v->variable->generatedVariable)
                    return *a;

                if (auto initial = v->variable->initialValue)
                    return evaluateAsExpression (*initial);

                return builder.createZeroInitialiser (v->getResultType());
            }

            if (auto member = cast<AST::StructMemberRef> (e))
            {
                auto structType = getStructType (*member);

                auto& source = evaluateAsExpression (member->object, structType);
                return createStructSubElement (*member, source);
            }

            if (auto subscript = cast<AST::ArrayElementRef> (e))
            {
                auto arrayOrVectorType = getArrayOrVectorType (*subscript);
                auto& source = evaluateAsExpression (*subscript->object, arrayOrVectorType);
                return createArraySubElement (*subscript, source);
            }

            if (auto c = cast<AST::TypeCast> (e))
            {
                SOUL_ASSERT (c->getNumArguments() != 0);

                pool_ref<AST::Expression> source = c->source;

                if (auto list = cast<AST::CommaSeparatedList> (c->source))
                {
                    if (list->items.size() != 1)
                        return createAggregateWithInitialisers (*c);

                    source = list->items.front();
                }

                auto& sourceExp = evaluateAsExpression (source);
                const auto& sourceType = sourceExp.getType();

                if (TypeRules::canCastTo (c->targetType, sourceType))
                    return builder.createCastIfNeeded (sourceExp, c->targetType);

                if (c->targetType.isFixedSizeAggregate() && c->targetType.getNumAggregateElements() == 1)
                    return createAggregateWithInitialisers (*c);

                SanityCheckPass::expectCastPossible (c->source->context, c->targetType, sourceType);
            }

            if (auto op = cast<AST::BinaryOperator> (e))
            {
                auto operandType = op->getOperandType();

                // (putting these into locals to make sure we evaluate everything in left-to-right order)
                auto& lhs = builder.createCastIfNeeded (evaluateAsExpression (op->lhs), operandType);
                auto& rhs = builder.createCastIfNeeded (evaluateAsExpression (op->rhs), operandType);

                return builder.createCastIfNeeded (builder.createBinaryOp (op->context.location, lhs, rhs, op->operation),
                                                   op->getResultType());
            }

            if (auto op = cast<AST::UnaryOperator> (e))
            {
                auto sourceType = op->getResultType();
                auto& source = builder.createCastIfNeeded (evaluateAsExpression (op->source), sourceType);
                return builder.createUnaryOp (op->context.location, source, op->operation);
            }

            if (auto pp = cast<AST::ProcessorProperty> (e))
            {
                if (module.isNamespace())
                    pp->context.throwError (Errors::processorPropertyUsedOutsideDecl());

                return module.allocator.allocate<heart::ProcessorProperty> (pp->context.location, pp->property);
            }
        }

        return getExpressionAsConstLocalCopy (e);
    }